

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O0

void __thiscall
Assimp::MDLImporter::AddAnimationBoneTrafoKey_3DGS_MDL7
          (MDLImporter *this,uint iTrafo,BoneTransform_MDL7 *pcBoneTransforms,
          IntBone_MDL7 **apcBonesOut)

{
  float *this_00;
  IntBone_MDL7 *pIVar1;
  IntBone_MDL7 *pcBoneOut;
  aiQuatKey qRotation;
  aiVectorKey vPosition;
  aiVectorKey vScaling;
  aiMatrix4x4 mTransform;
  IntBone_MDL7 **apcBonesOut_local;
  BoneTransform_MDL7 *pcBoneTransforms_local;
  uint iTrafo_local;
  MDLImporter *this_local;
  
  if (pcBoneTransforms == (BoneTransform_MDL7 *)0x0) {
    __assert_fail("__null != pcBoneTransforms",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/MDL/MDLLoader.cpp"
                  ,0x702,
                  "void Assimp::MDLImporter::AddAnimationBoneTrafoKey_3DGS_MDL7(unsigned int, const MDL::BoneTransform_MDL7 *, MDL::IntBone_MDL7 **)"
                 );
  }
  if (apcBonesOut != (IntBone_MDL7 **)0x0) {
    this_00 = &vScaling.mValue.z;
    aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)this_00);
    vScaling.mValue.z = pcBoneTransforms->m[0];
    vScaling._20_4_ = pcBoneTransforms->m[4];
    aiVectorKey::aiVectorKey((aiVectorKey *)&vPosition.mValue.z);
    aiVectorKey::aiVectorKey((aiVectorKey *)&qRotation.mValue.y);
    aiQuatKey::aiQuatKey((aiQuatKey *)&pcBoneOut);
    aiMatrix4x4t<float>::Decompose
              ((aiMatrix4x4t<float> *)this_00,(aiVector3t<float> *)&vScaling,
               (aiQuaterniont<float> *)&qRotation,(aiVector3t<float> *)&vPosition);
    pcBoneOut = (IntBone_MDL7 *)(double)iTrafo;
    pIVar1 = apcBonesOut[pcBoneTransforms->bone_index];
    qRotation.mValue._8_8_ = pcBoneOut;
    vPosition._16_8_ = pcBoneOut;
    std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::push_back
              (&pIVar1->pkeyPositions,(value_type *)&qRotation.mValue.y);
    std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::push_back
              (&pIVar1->pkeyScalings,(value_type *)&vPosition.mValue.z);
    std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::push_back
              (&pIVar1->pkeyRotations,(value_type *)&pcBoneOut);
    return;
  }
  __assert_fail("__null != apcBonesOut",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/MDL/MDLLoader.cpp"
                ,0x703,
                "void Assimp::MDLImporter::AddAnimationBoneTrafoKey_3DGS_MDL7(unsigned int, const MDL::BoneTransform_MDL7 *, MDL::IntBone_MDL7 **)"
               );
}

Assistant:

void MDLImporter::AddAnimationBoneTrafoKey_3DGS_MDL7(unsigned int iTrafo,
    const MDL::BoneTransform_MDL7* pcBoneTransforms,
    MDL::IntBone_MDL7** apcBonesOut)
{
    ai_assert(NULL != pcBoneTransforms);
    ai_assert(NULL != apcBonesOut);

    // first .. get the transformation matrix
    aiMatrix4x4 mTransform;
    mTransform.a1 = pcBoneTransforms->m[0];
    mTransform.b1 = pcBoneTransforms->m[1];
    mTransform.c1 = pcBoneTransforms->m[2];
    mTransform.d1 = pcBoneTransforms->m[3];

    mTransform.a2 = pcBoneTransforms->m[4];
    mTransform.b2 = pcBoneTransforms->m[5];
    mTransform.c2 = pcBoneTransforms->m[6];
    mTransform.d2 = pcBoneTransforms->m[7];

    mTransform.a3 = pcBoneTransforms->m[8];
    mTransform.b3 = pcBoneTransforms->m[9];
    mTransform.c3 = pcBoneTransforms->m[10];
    mTransform.d3 = pcBoneTransforms->m[11];

    // now decompose the transformation matrix into separate
    // scaling, rotation and translation
    aiVectorKey vScaling,vPosition;
    aiQuatKey qRotation;

    // FIXME: Decompose will assert in debug builds if the matrix is invalid ...
    mTransform.Decompose(vScaling.mValue,qRotation.mValue,vPosition.mValue);

    // now generate keys
    vScaling.mTime = qRotation.mTime = vPosition.mTime = (double)iTrafo;

    // add the keys to the bone
    MDL::IntBone_MDL7* const pcBoneOut = apcBonesOut[pcBoneTransforms->bone_index];
    pcBoneOut->pkeyPositions.push_back  ( vPosition );
    pcBoneOut->pkeyScalings.push_back   ( vScaling  );
    pcBoneOut->pkeyRotations.push_back  ( qRotation );
}